

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

chunk_conflict * lair_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  _Bool _Var1;
  ushort uVar2;
  connector *join;
  loc_conflict to_avoid;
  _Bool _Var3;
  int16_t iVar4;
  uint32_t uVar5;
  int iVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  wchar_t up_count;
  connector *pcVar9;
  chunk *c_00;
  chunk *c_01;
  int local_b8;
  int local_b4;
  int local_b0;
  wchar_t local_ac;
  wchar_t local_9c;
  wchar_t local_98;
  wchar_t local_94;
  wchar_t local_90;
  wchar_t local_8c;
  wchar_t local_88;
  connector *cached_join;
  chunk_conflict *lair;
  chunk_conflict *normal;
  chunk_conflict *c;
  wchar_t lair_offset;
  wchar_t normal_offset;
  wchar_t lair_width;
  wchar_t normal_width;
  wchar_t left_width;
  wchar_t x_size;
  wchar_t y_size;
  wchar_t size_percent;
  wchar_t k;
  wchar_t i;
  char **p_error_local;
  wchar_t min_width_local;
  wchar_t min_height_local;
  player *p_local;
  
  uVar5 = Rand_div(10);
  iVar6 = uVar5 + 1 + (int)p->depth / 0x18;
  if ((dun->quest & 1U) == 0) {
    if (iVar6 < 2) {
      x_size = L'K';
    }
    else if (iVar6 < 3) {
      x_size = L'P';
    }
    else if (iVar6 < 4) {
      x_size = L'U';
    }
    else if (iVar6 < 5) {
      x_size = L'Z';
    }
    else if (iVar6 < 6) {
      x_size = L'_';
    }
    else {
      x_size = L'd';
    }
  }
  else {
    x_size = L'd';
  }
  uVar2 = z_info->dungeon_hgt;
  uVar5 = Rand_div(10);
  local_90 = ((uint)uVar2 * (x_size + L'\xfffffffb' + uVar5)) / 100;
  uVar2 = z_info->dungeon_wid;
  uVar5 = Rand_div(10);
  local_9c = ((uint)uVar2 * (x_size + L'\xfffffffb' + uVar5)) / 100;
  local_88 = local_90;
  if (local_90 < min_height) {
    local_88 = min_height;
  }
  if ((int)(uint)z_info->dungeon_hgt < local_88) {
    local_8c = (wchar_t)z_info->dungeon_hgt;
  }
  else {
    if (local_90 < min_height) {
      local_90 = min_height;
    }
    local_8c = local_90;
  }
  local_94 = local_9c;
  if (local_9c < min_width) {
    local_94 = min_width;
  }
  if ((int)(uint)z_info->dungeon_wid < local_94) {
    local_98 = (wchar_t)z_info->dungeon_wid;
  }
  else {
    if (local_9c < min_width) {
      local_9c = min_width;
    }
    local_98 = local_9c;
  }
  dun->block_hgt = dun->profile->block_size;
  dun->block_wid = dun->profile->block_size;
  join = dun->join;
  dun->join = (connector *)0x0;
  if ((dun->persist & 1U) == 0) {
    if (join != (connector *)0x0) {
      __assert_fail("cached_join == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                    ,0xdee,"struct chunk *lair_gen(struct player *, int, int, const char **)");
    }
    lair_width = local_98 / 2;
  }
  else {
    if (local_98 / 0x14 < 5) {
      local_ac = local_98 / 0x14;
    }
    else {
      local_ac = L'\x05';
    }
    wVar7 = find_joinfree_vertical_seam(join,local_98 / 2,local_ac,L'\0',local_8c + L'\xffffffff');
    lair_width = wVar7 + L'\x01';
    if ((lair_width < L'\x04') || (local_98 - lair_width < 4)) {
      return (chunk_conflict *)0x0;
    }
  }
  uVar5 = Rand_div(2);
  if (uVar5 == 0) {
    normal_offset = lair_width;
    c._4_4_ = L'\0';
    lair_offset = local_98 - lair_width;
    c._0_4_ = lair_width;
  }
  else {
    normal_offset = local_98 - lair_width;
    c._4_4_ = lair_width;
    lair_offset = lair_width;
    c._0_4_ = L'\0';
  }
  pcVar9 = transform_join_list(join,local_8c,normal_offset,L'\0',c._4_4_,L'\0',false);
  dun->join = pcVar9;
  c_00 = (chunk *)modified_chunk(p,(int)p->depth,local_8c,normal_offset,(_Bool)(dun->persist & 1));
  cave_connectors_free(dun->join);
  dun->join = join;
  if (c_00 == (chunk *)0x0) {
    *p_error = "modified chunk could not be created";
    p_local = (player *)0x0;
  }
  else {
    pcVar9 = transform_join_list(join,local_8c,lair_offset,L'\0',(wchar_t)c,L'\0',false);
    dun->join = pcVar9;
    c_01 = (chunk *)cavern_chunk((int)p->depth,local_8c,lair_offset,dun->join);
    cave_connectors_free(dun->join);
    dun->join = join;
    if (c_01 == (chunk *)0x0) {
      uncreate_artifacts((chunk_conflict *)c_00);
      wipe_mon_list(c_00,p);
      cave_free((chunk_conflict *)c_00);
      *p_error = "cavern chunk could not be created";
      p_local = (player *)0x0;
    }
    else {
      if ((int)p->depth / 3 < 0xb) {
        local_b0 = (int)p->depth / 3;
      }
      else {
        local_b0 = 10;
      }
      if (local_b0 < 2) {
        local_b4 = 2;
      }
      else {
        if ((int)p->depth / 3 < 0xb) {
          local_b8 = (int)p->depth / 3;
        }
        else {
          local_b8 = 10;
        }
        local_b4 = local_b8;
      }
      uVar5 = local_b4 / 2;
      _Var3 = new_player_spot((chunk_conflict *)c_00,p);
      if (_Var3) {
        uVar8 = Rand_div(4);
        for (size_percent = uVar8 + 1 + uVar5; L'\0' < size_percent;
            size_percent = size_percent + L'\xffffffff') {
          to_avoid.x = (p->grid).x;
          to_avoid.y = (p->grid).y;
          pick_and_place_distant_monster(c_00,to_avoid,L'\0',true,c_00->depth);
        }
        for (size_percent = L'\0'; size_percent < (dun->profile->str).mag;
            size_percent = size_percent + L'\x01') {
          build_streamer((chunk_conflict *)c_00,L'\x11',(dun->profile->str).mc);
        }
        for (size_percent = L'\0'; size_percent < (dun->profile->str).qua;
            size_percent = size_percent + L'\x01') {
          build_streamer((chunk_conflict *)c_00,L'\x12',(dun->profile->str).qc);
        }
        uVar2 = z_info->level_monster_min;
        uVar8 = Rand_div(0x14);
        do {
          set_pit_type(c_01->depth,L'\0');
          _Var3 = mon_restrict(dun->pit_type->name,c_01->depth,c_01->depth,true);
        } while (!_Var3);
        if (((player->opts).opt[0x18] & 1U) != 0) {
          msg("Monster lair - %s",dun->pit_type->name);
        }
        spread_monsters(c_01,dun->pit_type->name,c_01->depth,(uint)uVar2 + uVar8 + 1 + uVar5,
                        c_01->height / 2,c_01->width / 2,c_01->height / 2,c_01->width / 2,'\a');
        mon_restrict((char *)0x0,c_01->depth,c_01->depth,false);
        p_local = (player *)cave_new(local_8c,local_98);
        *(int *)((long)&p_local->class + 4) = (int)p->depth;
        chunk_copy((chunk_conflict *)p_local,p,(chunk_conflict *)c_00,L'\0',c._4_4_,L'\0',false);
        chunk_copy((chunk_conflict *)p_local,p,(chunk_conflict *)c_01,L'\0',(wchar_t)c,L'\0',false);
        cave_free((chunk_conflict *)c_00);
        cave_free((chunk_conflict *)c_01);
        draw_rectangle((chunk_conflict *)p_local,L'\0',L'\0',
                       *(int *)&p_local->hitdie + L'\xffffffff',*(int *)&p_local->ht + L'\xffffffff'
                       ,L'\x16',L'\0',true);
        ensure_connectedness((chunk_conflict *)p_local,true);
        _Var3 = dun->persist;
        _Var1 = dun->quest;
        wVar7 = rand_range(3,4);
        up_count = rand_range(1,2);
        handle_level_stairs((chunk_conflict *)p_local,(_Bool)(_Var3 & 1),(_Bool)(_Var1 & 1),wVar7,
                            up_count);
        uVar8 = Rand_div(uVar5);
        alloc_objects((chunk_conflict *)p_local,L'\x01',L'\0',uVar8 + L'\x01',
                      *(int *)((long)&p_local->class + 4),'\0');
        uVar5 = Rand_div(uVar5);
        alloc_objects((chunk_conflict *)p_local,L'\x01',L'\x01',(int)(uVar5 + 1) / 5,
                      *(int *)((long)&p_local->class + 4),'\0');
        iVar4 = Rand_normal((uint)z_info->room_item_av,3);
        alloc_objects((chunk_conflict *)p_local,L'\x02',L'\x03',(int)iVar4,
                      *(int *)((long)&p_local->class + 4),'\x01');
        iVar4 = Rand_normal((uint)z_info->both_item_av,3);
        alloc_objects((chunk_conflict *)p_local,L'\x03',L'\x03',(int)iVar4,
                      *(int *)((long)&p_local->class + 4),'\x01');
        iVar4 = Rand_normal((uint)z_info->both_gold_av,3);
        alloc_objects((chunk_conflict *)p_local,L'\x03',L'\x02',(int)iVar4,
                      *(int *)((long)&p_local->class + 4),'\x01');
      }
      else {
        uncreate_artifacts((chunk_conflict *)c_01);
        cave_free((chunk_conflict *)c_01);
        uncreate_artifacts((chunk_conflict *)c_00);
        wipe_mon_list(c_00,p);
        cave_free((chunk_conflict *)c_00);
        *p_error = "could not place player";
        p_local = (player *)0x0;
      }
    }
  }
  return (chunk_conflict *)p_local;
}

Assistant:

struct chunk *lair_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	int size_percent, y_size, x_size;
	int left_width, normal_width, lair_width;
	int normal_offset, lair_offset;
	struct chunk *c;
	struct chunk *normal;
	struct chunk *lair;
	struct connector *cached_join;

	/* Scale the level */
	i = randint1(10) + p->depth / 24;
	if (dun->quest) size_percent = 100;
	else if (i < 2) size_percent = 75;
	else if (i < 3) size_percent = 80;
	else if (i < 4) size_percent = 85;
	else if (i < 5) size_percent = 90;
	else if (i < 6) size_percent = 95;
	else size_percent = 100;
	y_size = z_info->dungeon_hgt * (size_percent - 5 + randint0(10)) / 100;
	x_size = z_info->dungeon_wid * (size_percent - 5 + randint0(10)) / 100;

	/* Enforce dimension limits */
	y_size = MIN(MAX(y_size, min_height), z_info->dungeon_hgt);
	x_size = MIN(MAX(x_size, min_width), z_info->dungeon_wid);

	/* Set the block height and width */
	dun->block_hgt = dun->profile->block_size;
	dun->block_wid = dun->profile->block_size;

	cached_join = dun->join;
	dun->join = NULL;
	if (dun->persist) {
		left_width = 1 + find_joinfree_vertical_seam(cached_join,
			x_size / 2, MIN(5, x_size / 20), 0, y_size - 1);
		if (left_width < 4 || x_size - left_width < 4) return NULL;
	} else {
		assert(cached_join == NULL);
		left_width = x_size / 2;
	}
	if (one_in_(2)) {
		/* Place the normal part on the left. */
		normal_width = left_width;
		normal_offset = 0;
		lair_width = x_size - left_width;
		lair_offset = left_width;
	} else {
		/* Place the lair part on the left. */
		normal_width = x_size - left_width;
		normal_offset = left_width;
		lair_width = left_width;
		lair_offset = 0;
	}

	/*
	 * The transformation applied here should match that for chunk_copy()
	 * below.
	 */
	dun->join = transform_join_list(cached_join, y_size, normal_width,
		0, normal_offset, 0, false);
	normal = modified_chunk(p, p->depth, y_size, normal_width,
		dun->persist);
	/* Done with the transformed connector information. */
	cave_connectors_free(dun->join);
	dun->join = cached_join;
	if (!normal) {
		*p_error = "modified chunk could not be created";
		return NULL;
	}

	/*
	 * The transformation applied here should match that for chunk_copy()
	 * below.
	 */
	dun->join = transform_join_list(cached_join, y_size, lair_width,
		0, lair_offset, 0, false);
	lair = cavern_chunk(p->depth, y_size, lair_width, dun->join);
	/* Done with the transformed connector information. */
	cave_connectors_free(dun->join);
	dun->join = cached_join;
	if (!lair) {
		uncreate_artifacts(normal);
		wipe_mon_list(normal, p);
		cave_free(normal);
		*p_error = "cavern chunk could not be created";
		return NULL;
	}

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(p->depth / 3, 10), 2) / 2;

	/* Put the character in the normal half */
	if (!new_player_spot(normal, p)) {
		uncreate_artifacts(lair);
		cave_free(lair);
		uncreate_artifacts(normal);
		wipe_mon_list(normal, p);
		cave_free(normal);
		*p_error = "could not place player";
		return NULL;
	}

	/* Pick a smallish number of monsters for the normal half */
	i = randint1(4) + k;

	/* Put some monsters in the dungeon */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(normal, p->grid, 0, true,
			normal->depth);
	}

	/* Add some magma streamers */
	for (i = 0; i < dun->profile->str.mag; i++)
		build_streamer(normal, FEAT_MAGMA, dun->profile->str.mc);

	/* Add some quartz streamers */
	for (i = 0; i < dun->profile->str.qua; i++)
		build_streamer(normal, FEAT_QUARTZ, dun->profile->str.qc);

	/* Pick a larger number of monsters for the lair */
	i = (z_info->level_monster_min + randint1(20) + k);

	/* Find appropriate monsters */
	while (true) {
		/* Choose a pit profile */
		set_pit_type(lair->depth, 0);

		/* Set monster generation restrictions */
		if (mon_restrict(dun->pit_type->name, lair->depth, lair->depth, true))
			break;
	}

	ROOM_LOG("Monster lair - %s", dun->pit_type->name);

	/* Place lair monsters */
	spread_monsters(lair, dun->pit_type->name, lair->depth, i, lair->height / 2,
					lair->width / 2, lair->height / 2, lair->width / 2, 
					ORIGIN_CAVERN);

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, lair->depth, lair->depth, false);

	/* Make the level */
	c = cave_new(y_size, x_size);
	c->depth = p->depth;
	chunk_copy(c, p, normal, 0, normal_offset, 0, false);
	chunk_copy(c, p, lair, 0, lair_offset, 0, false);

	/* Free the chunks */
	cave_free(normal);
	cave_free(lair);

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect */
	ensure_connectedness(c, true);

	/* Place 3 or 4 down stairs and 1 or 2 up stairs near some walls */
	handle_level_stairs(c, dun->persist, dun->quest,
		rand_range(3, 4), rand_range(1, 2));

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon, reduce frequency by factor of 5 */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k)/5, c->depth, 0);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}